

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O3

void __thiscall rtb::Concurrency::Queue<int>::~Queue(Queue<int> *this)

{
  Queue<int> *pQVar1;
  Queue<int> *pQVar2;
  
  std::condition_variable::~condition_variable(&this->cond_);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::~_Rb_tree(&(this->subscribersMissingRead_)._M_t);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  ::~_Rb_tree(&(this->subscribersNextRead_)._M_t);
  pQVar2 = (Queue<int> *)
           (this->queue_).super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (pQVar2 != this) {
    pQVar1 = (Queue<int> *)
             (pQVar2->queue_).
             super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    operator_delete(pQVar2,0x18);
    pQVar2 = pQVar1;
  }
  return;
}

Assistant:

Queue() = default;